

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O1

void __thiscall ExprWriter::visit(ExprWriter *this,AsmExpr *expr)

{
  pointer ppVar1;
  Expr *pEVar2;
  size_type sVar3;
  char cVar4;
  bool bVar5;
  ostream *poVar6;
  iterator __begin2;
  pointer ppVar7;
  pointer ppVar8;
  
  poVar6 = this->ss;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"__asm__(\"",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(expr->inst)._M_dataplus._M_p,(expr->inst)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  this->indentCount = this->indentCount + 1;
  indent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,": ",2);
  ppVar8 = (expr->output).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (expr->output).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 != ppVar1) {
    bVar5 = true;
    do {
      ppVar7 = ppVar8 + 1;
      pEVar2 = ppVar8->second;
      if (pEVar2 != (Expr *)0x0) {
        if (!bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>(this->ss,", ",2);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (this->ss,(ppVar8->first)._M_dataplus._M_p,
                            (ppVar8->first)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
        (*ppVar8->second->_vptr_Expr[2])(ppVar8->second,this);
        std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
        bVar5 = false;
      }
    } while ((pEVar2 != (Expr *)0x0) && (ppVar8 = ppVar7, ppVar7 != ppVar1));
  }
  cVar4 = (char)this->ss;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->ss + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  indent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,": ",2);
  ppVar8 = (expr->input).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (expr->input).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 != ppVar1) {
    bVar5 = true;
    do {
      if (!bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>(this->ss,", ",2);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->ss,(ppVar8->first)._M_dataplus._M_p,(ppVar8->first)._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
      (*ppVar8->second->_vptr_Expr[2])(ppVar8->second,this);
      std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
      ppVar8 = ppVar8 + 1;
      bVar5 = false;
    } while (ppVar8 != ppVar1);
  }
  cVar4 = (char)this->ss;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->ss + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  indent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,": ",2);
  sVar3 = (expr->clobbers)._M_string_length;
  if (sVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->ss,(expr->clobbers)._M_dataplus._M_p,sVar3);
  }
  cVar4 = (char)this->ss;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->ss + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  this->indentCount = this->indentCount - 1;
  indent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
  return;
}

Assistant:

void ExprWriter::visit(AsmExpr& expr) {
    ss << "__asm__(\"" << expr.inst << "\"" << std::endl;
    indentCount++;
    indent();
    ss << ": ";
    if (!expr.output.empty()) {
        bool first = true;
        for (const auto& out : expr.output) {
            if (!out.second) {
                break;
            }
            if (!first) {
                ss << ", ";
            }
            first = false;

            ss << out.first << " (";
            out.second->accept(*this);
            ss << ")";
        }
    }

    ss << std::endl;
    indent();
    ss << ": ";

    if (!expr.input.empty()) {
        bool first = true;
        for (const auto& in : expr.input) {
            if (!first) {
                ss << ", ";
            }
            first = false;

            ss << in.first << " (";
            in.second->accept(*this);
            ss << ")";
        }
    }

    ss << std::endl;
    indent();
    ss << ": ";

    if (!expr.clobbers.empty()) {
        ss << expr.clobbers;
    }

    ss << std::endl;

    indentCount--;
    indent();
    ss << ")";

}